

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.cpp
# Opt level: O0

void * RazorAHRSThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double local_cb8;
  interval local_cb0;
  double local_c98;
  interval local_c90;
  interval local_c78;
  double local_c60;
  interval local_c58;
  double local_c40;
  interval local_c38;
  interval local_c20;
  double local_c08;
  interval local_c00;
  double local_be8;
  interval local_be0;
  interval local_bc8;
  double local_bb0;
  interval local_ba8;
  double local_b90;
  interval local_b88;
  interval local_b70;
  double local_b58;
  interval local_b50;
  double local_b38;
  interval local_b30;
  interval local_b18;
  double local_b00;
  interval local_af8;
  interval local_ae0;
  interval local_ac8;
  double local_ab0;
  interval local_aa8;
  double local_a90;
  interval local_a88;
  interval local_a70;
  double local_a58;
  interval local_a50;
  double local_a38;
  interval local_a30;
  interval local_a18;
  double local_a00;
  interval local_9f8;
  double local_9e0;
  interval local_9d8;
  interval local_9c0;
  char local_9a8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_79c;
  int local_798;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_740 [4];
  BOOL bConnected;
  RAZORAHRSDATA razorahrsdata;
  timeval tv;
  RAZORAHRS razorahrs;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_798 = 0;
  razorahrs.yawp2 = (double)pParam;
  memset(&tv.tv_usec,0,0x6c0);
  memset(&razorahrsdata.Yaw,0,0x10);
  memset(local_740,0,0x60);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseRazorAHRS == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("RazorAHRS paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectRazorAHRS((RAZORAHRS *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_00157423;
      mSleep(100);
    }
    if (bRestartRazorAHRS != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a RazorAHRS.\n");
        chrono_period._68_4_ = 0;
        DisconnectRazorAHRS((RAZORAHRS *)&tv.tv_usec);
      }
      bRestartRazorAHRS = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectRazorAHRS((RAZORAHRS *)&tv.tv_usec,"RazorAHRS0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = razorahrs.BaudRate;
        memset(&razorahrsdata.Yaw,0,0x10);
        memset(local_740,0,0x60);
        if (razorahrs.RS232Port._784_8_ != 0) {
          fclose((FILE *)razorahrs.RS232Port._784_8_);
          razorahrs.RS232Port.DevType = 0;
          razorahrs.RS232Port._788_4_ = 0;
        }
        if ((razorahrs.timeout != 0) && (razorahrs.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&razorahrs.LastRazorAHRSData.Yaw);
          if (sVar2 == 0) {
            sprintf(local_9a8,"razorahrs");
          }
          else {
            sprintf(local_9a8,"%.127s",&razorahrs.LastRazorAHRSData.Yaw);
          }
          sVar2 = strlen(local_9a8);
          local_79c = (int)sVar2;
          do {
            local_79c = local_79c + -1;
            if (local_79c < 0) break;
          } while (local_9a8[local_79c] != '.');
          if ((0 < local_79c) && (sVar2 = strlen(local_9a8), local_79c < (int)sVar2)) {
            sVar2 = strlen(local_9a8);
            memset(local_9a8 + local_79c,0,sVar2 - (long)local_79c);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_9a8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          razorahrs.RS232Port._784_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)razorahrs.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create RazorAHRS data file.\n");
            goto LAB_00157423;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetLatestDataRazorAHRS((RAZORAHRS *)&tv.tv_usec,(RAZORAHRSDATA *)local_740);
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)&razorahrsdata.Yaw,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          razorahrsdata.Yaw = 0.0;
          tv.tv_sec = 0;
        }
        EnterCriticalSection(&StateVariablesCS);
        local_9e0 = fmod_2PI(razorahrsdata.gyrz);
        interval::interval(&local_9d8,&local_9e0);
        local_a00 = -phi_ahrs_acc;
        interval::interval(&local_9f8,&local_a00,&phi_ahrs_acc);
        operator+(&local_9c0,&local_9d8,&local_9f8);
        interval::operator=((interval *)&phi_ahrs,&local_9c0);
        local_a38 = fmod_2PI(-razorahrsdata.Roll);
        interval::interval(&local_a30,&local_a38);
        local_a58 = -theta_ahrs_acc;
        interval::interval(&local_a50,&local_a58,&theta_ahrs_acc);
        operator+(&local_a18,&local_a30,&local_a50);
        interval::operator=((interval *)&theta_ahrs,&local_a18);
        local_a90 = fmod_2PI((1.5707963267948966 - razorahrsdata.Pitch) - angle_env);
        interval::interval(&local_a88,&local_a90);
        local_ab0 = -psi_ahrs_acc;
        interval::interval(&local_aa8,&local_ab0,&psi_ahrs_acc);
        operator+(&local_a70,&local_a88,&local_aa8);
        interval::operator=((interval *)&psi_ahrs,&local_a70);
        if ((razorahrs.threadperiod != 0) &&
           ((((((razorahrsdata.accz != 0.0 || (NAN(razorahrsdata.accz))) ||
               (razorahrsdata.gyrx != 0.0)) ||
              (((NAN(razorahrsdata.gyrx) || (razorahrsdata.gyry != 0.0)) ||
               ((NAN(razorahrsdata.gyry) ||
                ((razorahrsdata.roll != 0.0 || (NAN(razorahrsdata.roll))))))))) ||
             (razorahrsdata.accx != 0.0)) ||
            (((NAN(razorahrsdata.accx) || (razorahrsdata.accy != 0.0)) || (NAN(razorahrsdata.accy)))
            )))) {
          interval::interval(&local_ae0,&razorahrsdata.accz);
          local_b00 = -omegax_ahrs_acc;
          interval::interval(&local_af8,&local_b00,&omegax_ahrs_acc);
          operator+(&local_ac8,&local_ae0,&local_af8);
          interval::operator=((interval *)&omegax_ahrs,&local_ac8);
          local_b38 = -razorahrsdata.gyrx;
          interval::interval(&local_b30,&local_b38);
          local_b58 = -omegay_ahrs_acc;
          interval::interval(&local_b50,&local_b58,&omegay_ahrs_acc);
          operator+(&local_b18,&local_b30,&local_b50);
          interval::operator=((interval *)&omegay_ahrs,&local_b18);
          local_b90 = -razorahrsdata.gyry;
          interval::interval(&local_b88,&local_b90);
          local_bb0 = -omegaz_ahrs_acc;
          interval::interval(&local_ba8,&local_bb0,&omegaz_ahrs_acc);
          operator+(&local_b70,&local_b88,&local_ba8);
          interval::operator=((interval *)&omegaz_ahrs,&local_b70);
          local_be8 = (razorahrsdata.roll * 9.8) / 256.0;
          interval::interval(&local_be0,&local_be8);
          local_c08 = -accrx_ahrs_acc;
          interval::interval(&local_c00,&local_c08,&accrx_ahrs_acc);
          operator+(&local_bc8,&local_be0,&local_c00);
          interval::operator=((interval *)&accrx_ahrs,&local_bc8);
          local_c40 = (-razorahrsdata.accx * 9.8) / 256.0;
          interval::interval(&local_c38,&local_c40);
          local_c60 = -accry_ahrs_acc;
          interval::interval(&local_c58,&local_c60,&accry_ahrs_acc);
          operator+(&local_c20,&local_c38,&local_c58);
          interval::operator=((interval *)&accry_ahrs,&local_c20);
          local_c98 = (-razorahrsdata.accy * 9.8) / 256.0;
          interval::interval(&local_c90,&local_c98);
          local_cb8 = -accrz_ahrs_acc;
          interval::interval(&local_cb0,&local_cb8,&accrz_ahrs_acc);
          operator+(&local_c78,&local_c90,&local_cb0);
          interval::operator=((interval *)&accrz_ahrs,&local_c78);
        }
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a RazorAHRS lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectRazorAHRS((RAZORAHRS *)&tv.tv_usec);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_798 = local_798 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_798)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_00157423:
      StopChronoQuick((CHRONO *)&errcount);
      if (razorahrs.RS232Port._784_8_ != 0) {
        fclose((FILE *)razorahrs.RS232Port._784_8_);
        razorahrs.RS232Port.DevType = 0;
        razorahrs.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectRazorAHRS((RAZORAHRS *)&tv.tv_usec);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS razorahrs;
	struct timeval tv;
	RAZORAHRSDATA razorahrsdata;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&razorahrs, 0, sizeof(RAZORAHRS));

	memset(&tv, 0, sizeof(tv));
	memset(&razorahrsdata, 0, sizeof(razorahrsdata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("RazorAHRS paused.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("Restarting a RazorAHRS.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			bRestartRazorAHRS = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRazorAHRS(&razorahrs, "RazorAHRS0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = razorahrs.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&razorahrsdata, 0, sizeof(razorahrsdata));

				if (razorahrs.pfSaveFile != NULL)
				{
					fclose(razorahrs.pfSaveFile); 
					razorahrs.pfSaveFile = NULL;
				}
				if ((razorahrs.bSaveRawData)&&(razorahrs.pfSaveFile == NULL)) 
				{
					if (strlen(razorahrs.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", razorahrs.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "razorahrs");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					razorahrs.pfSaveFile = fopen(szSaveFilePath, "w");
					if (razorahrs.pfSaveFile == NULL) 
					{
						printf("Unable to create RazorAHRS data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataRazorAHRS(&razorahrs, &razorahrsdata) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(razorahrsdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				theta_ahrs = fmod_2PI(-razorahrsdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-razorahrsdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);

				if ((razorahrs.bROSMode)&&
					!((razorahrsdata.gyrx == 0)&&(razorahrsdata.gyry == 0)&&(razorahrsdata.gyrz == 0)&&
					(razorahrsdata.accx == 0)&&(razorahrsdata.accy == 0)&&(razorahrsdata.accz == 0)))
				{
					omegax_ahrs = razorahrsdata.gyrx+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
					omegay_ahrs = -razorahrsdata.gyry+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
					omegaz_ahrs = -razorahrsdata.gyrz+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
					accrx_ahrs = razorahrsdata.accx*9.8/256.0+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
					accry_ahrs = -razorahrsdata.accy*9.8/256.0+interval(-accry_ahrs_acc, accry_ahrs_acc);
					accrz_ahrs = -razorahrsdata.accz*9.8/256.0+interval(-accrz_ahrs_acc, accrz_ahrs_acc);
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a RazorAHRS lost.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
		}

		//printf("RazorAHRSThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (razorahrs.pfSaveFile != NULL)
	{
		fclose(razorahrs.pfSaveFile); 
		razorahrs.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRazorAHRS(&razorahrs);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}